

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

void __thiscall MinVR::VRDatumString::VRDatumString(VRDatumString *this,VRString *inVal)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)inVal);
  VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
  ::VRDatumSpecialized
            (&this->
              super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
             ,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->
  super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
  ).super_VRDatum._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_00124410;
  return;
}

Assistant:

VRDatumString(const VRString inVal) :
    VRDatumSpecialized<VRString, VRCORETYPE_STRING>(inVal) {}